

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer.h
# Opt level: O0

void __thiscall
mp::ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>::
VisitUnary(ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>
           *this,UnaryExpr e)

{
  BasicStringRef<char> value;
  Kind kind;
  char *in_RSI;
  BasicWriter<char> *in_RDI;
  size_t unaff_retaddr;
  int in_stack_00000014;
  ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>
  *in_stack_00000018;
  ExprBase in_stack_00000020;
  Buffer<char> *this_00;
  char value_00;
  BasicWriter<char> *this_01;
  
  this_00 = in_RDI->buffer_;
  this_01 = in_RDI;
  kind = internal::ExprBase::kind((ExprBase *)0x6e204a);
  mp::expr::str(kind);
  fmt::BasicStringRef<char>::BasicStringRef((BasicStringRef<char> *)in_RDI,(char *)this_00);
  value.size_ = unaff_retaddr;
  value.data_ = in_RSI;
  fmt::BasicWriter<char>::operator<<(this_01,value);
  fmt::BasicWriter<char>::operator<<(in_RDI,(char)((ulong)this_00 >> 0x38));
  BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)4,_(mp::expr::Kind)24>
  ::arg((BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)4,_(mp::expr::Kind)24>
         *)this_00);
  value_00 = (char)((ulong)this_00 >> 0x38);
  Visit(in_stack_00000018,(NumericExpr)in_stack_00000020.impl_,in_stack_00000014);
  fmt::BasicWriter<char>::operator<<(in_RDI,value_00);
  return;
}

Assistant:

void VisitUnary(UnaryExpr e) {
    writer_ << str(e.kind()) << '(';
    Visit(e.arg(), prec::UNKNOWN);
    writer_ << ')';
  }